

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::Message::GetOption
          (Error *__return_storage_ptr__,Message *this,string *aValue,OptionType aNumber)

{
  v10 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  string_view fmt;
  format_args args;
  string local_170;
  anon_class_1_0_00000001 local_14a;
  v10 local_149;
  v10 *local_148;
  char *local_140;
  string local_138;
  Error local_118;
  OptionValue *local_e0;
  OptionValue *option;
  string *psStack_d0;
  OptionType aNumber_local;
  string *aValue_local;
  Message *this_local;
  Error *error;
  undefined1 local_a0 [16];
  v10 *local_90;
  char *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ot::commissioner::coap::OptionType>
  *local_80;
  v10 *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  option._5_1_ = 0;
  option._6_2_ = aNumber;
  psStack_d0 = aValue;
  aValue_local = (string *)this;
  this_local = (Message *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  this_00 = (v10 *)(ulong)option._6_2_;
  local_e0 = GetOption(this,option._6_2_);
  if (local_e0 == (OptionValue *)0x0) {
    GetOption::anon_class_1_0_00000001::operator()(&local_14a);
    local_58 = &local_148;
    local_60 = &local_149;
    bVar1 = ::fmt::v10::operator()(local_60);
    local_140 = (char *)bVar1.size_;
    local_148 = (v10 *)bVar1.data_;
    ::fmt::v10::detail::
    check_format_string<ot::commissioner::coap::OptionType_&,_FMT_COMPILE_STRING,_0>();
    local_68 = &local_138;
    local_78 = local_148;
    pcStack_70 = local_140;
    local_80 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ot::commissioner::coap::OptionType>
                *)((long)&option + 6);
    local_50 = &local_78;
    local_90 = local_148;
    local_88 = local_140;
    local_48 = local_90;
    pcStack_40 = local_88;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,ot::commissioner::coap::OptionType>
                               (local_80,this_00,(OptionType *)local_68);
    local_30 = local_a0;
    local_38 = &error;
    local_18 = 0xf;
    fmt.size_ = 0xf;
    fmt.data_ = local_88;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_138,local_90,fmt,args);
    Error::Error(&local_118,kNotFound,&local_138);
    Error::operator=(__return_storage_ptr__,&local_118);
    Error::~Error(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
  }
  else {
    OptionValue::GetStringValue_abi_cxx11_(&local_170,local_e0);
    std::__cxx11::string::operator=((string *)psStack_d0,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::GetOption(std::string &aValue, OptionType aNumber) const
{
    Error error;
    auto  option = GetOption(aNumber);

    VerifyOrExit(option != nullptr, error = ERROR_NOT_FOUND("CoAP option {} not found", aNumber));

    aValue = option->GetStringValue();

exit:
    return error;
}